

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

int Gia_ManCompare(Gia_Man_t *p1,Gia_Man_t *p2)

{
  uint uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  char *__format;
  Gia_Obj_t *pGVar7;
  long lVar8;
  int iVar9;
  int iVar11;
  undefined1 auVar10 [16];
  int iVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  
  auVar2 = _DAT_00912220;
  uVar1 = p1->nObjs;
  uVar4 = (ulong)uVar1;
  if (uVar1 == p2->nObjs) {
    iVar6 = 1;
    if (0 < (int)uVar1) {
      pGVar5 = p1->pObjs;
      lVar8 = uVar4 - 1;
      auVar10._8_4_ = (int)lVar8;
      auVar10._0_8_ = lVar8;
      auVar10._12_4_ = (int)((ulong)lVar8 >> 0x20);
      lVar8 = 0;
      auVar10 = auVar10 ^ _DAT_00912220;
      auVar17 = _DAT_009134e0;
      auVar14 = _DAT_00912210;
      do {
        auVar16 = auVar14 ^ auVar2;
        iVar9 = auVar10._0_4_;
        iVar11 = auVar10._4_4_;
        iVar12 = auVar10._12_4_;
        if ((bool)(~(auVar16._4_4_ == iVar11 && iVar9 < auVar16._0_4_ || iVar11 < auVar16._4_4_) & 1
                  )) {
          *(undefined4 *)((long)&pGVar5->Value + lVar8) = 0;
        }
        if ((auVar16._12_4_ != iVar12 || auVar16._8_4_ <= auVar10._8_4_) && auVar16._12_4_ <= iVar12
           ) {
          *(undefined4 *)((long)&pGVar5[1].Value + lVar8) = 0;
        }
        iVar18 = SUB164(auVar17 ^ auVar2,4);
        if (iVar18 <= iVar11 && (iVar18 != iVar11 || SUB164(auVar17 ^ auVar2,0) <= iVar9)) {
          *(undefined4 *)((long)&pGVar5[2].Value + lVar8) = 0;
          *(undefined4 *)((long)&pGVar5[3].Value + lVar8) = 0;
        }
        lVar13 = auVar14._8_8_;
        auVar14._0_8_ = auVar14._0_8_ + 4;
        auVar14._8_8_ = lVar13 + 4;
        lVar13 = auVar17._8_8_;
        auVar17._0_8_ = auVar17._0_8_ + 4;
        auVar17._8_8_ = lVar13 + 4;
        lVar8 = lVar8 + 0x30;
      } while ((uVar4 + 3 >> 2 & 0x3fffffff) * 0x30 != lVar8);
      if (0 < (int)uVar1) {
        pGVar5 = p2->pObjs;
        lVar8 = 0;
        auVar16 = _DAT_009134e0;
        auVar15 = _DAT_00912210;
        do {
          auVar17 = auVar15 ^ auVar2;
          if ((bool)(~(auVar17._4_4_ == iVar11 && iVar9 < auVar17._0_4_ || iVar11 < auVar17._4_4_) &
                    1)) {
            *(undefined4 *)((long)&pGVar5->Value + lVar8) = 0;
          }
          if ((auVar17._12_4_ != iVar12 || auVar17._8_4_ <= auVar10._8_4_) &&
              auVar17._12_4_ <= iVar12) {
            *(undefined4 *)((long)&pGVar5[1].Value + lVar8) = 0;
          }
          iVar18 = SUB164(auVar16 ^ auVar2,4);
          if (iVar18 <= iVar11 && (iVar18 != iVar11 || SUB164(auVar16 ^ auVar2,0) <= iVar9)) {
            *(undefined4 *)((long)&pGVar5[2].Value + lVar8) = 0;
            *(undefined4 *)((long)&pGVar5[3].Value + lVar8) = 0;
          }
          lVar13 = auVar15._8_8_;
          auVar15._0_8_ = auVar15._0_8_ + 4;
          auVar15._8_8_ = lVar13 + 4;
          lVar13 = auVar16._8_8_;
          auVar16._0_8_ = auVar16._0_8_ + 4;
          auVar16._8_8_ = lVar13 + 4;
          lVar8 = lVar8 + 0x30;
        } while ((uVar4 + 3 >> 2 & 0x3fffffff) * 0x30 != lVar8);
        if ((0 < (int)uVar1) && (pGVar5 = p1->pObjs, pGVar5 != (Gia_Obj_t *)0x0)) {
          pGVar7 = p2->pObjs;
          lVar8 = 0;
          uVar3 = 0;
          do {
            if (uVar4 == uVar3) {
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                            ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            if (pGVar5->Value != pGVar7->Value || *(long *)pGVar5 != *(long *)pGVar7) {
              __format = "Objects %d are different.\n";
LAB_0023cb12:
              printf(__format,uVar3 & 0xffffffff);
              return 0;
            }
            if (((p1->pReprs != (Gia_Rpr_t *)0x0) && (p2->pReprs != (Gia_Rpr_t *)0x0)) &&
               (*(int *)(&p1->pReprs->field_0x0 + lVar8) != *(int *)(&p2->pReprs->field_0x0 + lVar8)
               )) {
              __format = "Representatives of objects %d are different.\n";
              goto LAB_0023cb12;
            }
            uVar3 = uVar3 + 1;
            pGVar5 = pGVar5 + 1;
            pGVar7 = pGVar7 + 1;
            lVar8 = lVar8 + 4;
          } while (uVar4 != uVar3);
        }
      }
    }
  }
  else {
    puts("AIGs have different number of objects.");
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int Gia_ManCompare( Gia_Man_t * p1, Gia_Man_t * p2 )
{
    Gia_Obj_t * pObj1, * pObj2;
    int i;
    if ( Gia_ManObjNum(p1) != Gia_ManObjNum(p2) )
    {
        printf( "AIGs have different number of objects.\n" );
        return 0;
    }
    Gia_ManCleanValue( p1 );
    Gia_ManCleanValue( p2 );
    Gia_ManForEachObj( p1, pObj1, i )
    {
        pObj2 = Gia_ManObj( p2, i );
        if ( memcmp( pObj1, pObj2, sizeof(Gia_Obj_t) ) )
        {
            printf( "Objects %d are different.\n", i );
            return 0;
        }
        if ( p1->pReprs && p2->pReprs )
        {
            if ( memcmp( &p1->pReprs[i], &p2->pReprs[i], sizeof(Gia_Rpr_t) ) )
            {
                printf( "Representatives of objects %d are different.\n", i );
                return 0;
            }
        }
    }
    return 1;
}